

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

int mu_mouse_over(mu_Context *ctx,mu_Rect rect)

{
  int iVar1;
  mu_Rect r;
  bool local_31;
  mu_Context *ctx_local;
  mu_Rect rect_local;
  
  iVar1 = rect_overlaps_vec2(rect,ctx->mouse_pos);
  local_31 = false;
  if (iVar1 != 0) {
    r = mu_get_clip_rect(ctx);
    iVar1 = rect_overlaps_vec2(r,ctx->mouse_pos);
    local_31 = false;
    if (iVar1 != 0) {
      iVar1 = in_hover_root(ctx);
      local_31 = iVar1 != 0;
    }
  }
  return (int)local_31;
}

Assistant:

int mu_mouse_over(mu_Context *ctx, mu_Rect rect) {
  return rect_overlaps_vec2(rect, ctx->mouse_pos) &&
    rect_overlaps_vec2(mu_get_clip_rect(ctx), ctx->mouse_pos) &&
    in_hover_root(ctx);
}